

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-try-write-error.c
# Opt level: O1

void connection_cb(uv_stream_t *server,int status)

{
  int iVar1;
  undefined8 *extraout_RDX;
  uv_tcp_t *puVar2;
  uv_write_t *puVar3;
  uv_buf_t buf;
  uv_buf_t local_10;
  
  if (server == (uv_stream_t *)&tcp_server) {
    puVar3 = (uv_write_t *)server;
    if (status != 0) goto LAB_001725a1;
    status = 0x51ea98;
    puVar3 = (uv_write_t *)tcp_server.loop;
    iVar1 = uv_tcp_init(tcp_server.loop,&tcp_peer);
    if (iVar1 != 0) goto LAB_001725a6;
    puVar2 = &tcp_server;
    status = 0x51ea98;
    iVar1 = uv_accept((uv_stream_t *)&tcp_server,(uv_stream_t *)&tcp_peer);
    puVar3 = (uv_write_t *)puVar2;
    if (iVar1 != 0) goto LAB_001725ab;
    puVar2 = &tcp_peer;
    status = 0x1725e4;
    iVar1 = uv_read_start((uv_stream_t *)&tcp_peer,alloc_cb,read_cb);
    puVar3 = (uv_write_t *)puVar2;
    if (iVar1 == 0) {
      local_10.base = "hello\n";
      local_10.len = 6;
      puVar3 = &write_req;
      status = 0x51ea98;
      iVar1 = uv_write(&write_req,(uv_stream_t *)&tcp_peer,&local_10,1,write_cb);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_001725b5;
    }
  }
  else {
    connection_cb_cold_1();
    puVar3 = (uv_write_t *)server;
LAB_001725a1:
    connection_cb_cold_2();
LAB_001725a6:
    connection_cb_cold_3();
LAB_001725ab:
    connection_cb_cold_4();
  }
  connection_cb_cold_5();
LAB_001725b5:
  connection_cb_cold_6();
  if (puVar3 == (uv_write_t *)&connect_req) {
    if (status == 0) {
      uv_close((uv_handle_t *)&tcp_client,(uv_close_cb)0x0);
      return;
    }
  }
  else {
    connect_cb_cold_1();
  }
  connect_cb_cold_2();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 0x400;
  return;
}

Assistant:

static void connection_cb(uv_stream_t* tcp, int status) {
  ASSERT(status == 0);

  ASSERT(0 == uv_tcp_init(tcp->loop, &incoming));
  ASSERT(0 == uv_accept(tcp, (uv_stream_t*) &incoming));

  connection_cb_called++;
  uv_close((uv_handle_t*) &incoming, incoming_close_cb);
  uv_close((uv_handle_t*) tcp, close_cb);
}